

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::btranPF(HFactor *this,HVector *vector)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  int *piVar4;
  double *pdVar5;
  int *piVar6;
  int *piVar7;
  double *pdVar8;
  int *piVar9;
  double *pdVar10;
  long in_RSI;
  long in_RDI;
  HighsInt k;
  double pivot_multiplier;
  HighsInt pivotRow;
  HighsInt i;
  double *rhs_array;
  HighsInt *rhs_index;
  HighsInt rhs_count;
  double *pf_value;
  HighsInt *pf_index;
  HighsInt *pf_start;
  double *pf_pivot_value;
  HighsInt *pf_pivot_index;
  HighsInt pf_pivot_count;
  double local_80;
  int local_6c;
  double local_68;
  int local_5c;
  int local_44;
  
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x668));
  piVar4 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x7d54c2);
  pdVar5 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x7d54d8);
  piVar6 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x7d54ee);
  piVar7 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x7d5504);
  pdVar8 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x7d551a);
  local_44 = *(int *)(in_RSI + 4);
  piVar9 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x7d5539);
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x7d554c);
  iVar2 = (int)sVar3;
  while (local_5c = iVar2 + -1, -1 < local_5c) {
    iVar1 = piVar4[local_5c];
    local_68 = pdVar10[iVar1];
    for (local_6c = piVar6[local_5c]; local_6c < piVar6[iVar2]; local_6c = local_6c + 1) {
      local_68 = -pdVar8[local_6c] * pdVar10[piVar7[local_6c]] + local_68;
    }
    local_80 = local_68 / pdVar5[local_5c];
    if ((pdVar10[iVar1] == 0.0) && (!NAN(pdVar10[iVar1]))) {
      piVar9[local_44] = iVar1;
      local_44 = local_44 + 1;
    }
    if (ABS(local_80) < 1e-14) {
      local_80 = 1e-100;
    }
    pdVar10[iVar1] = local_80;
    iVar2 = local_5c;
  }
  *(int *)(in_RSI + 4) = local_44;
  return;
}

Assistant:

void HFactor::btranPF(HVector& vector) const {
  // Alias to PF buffer
  const HighsInt pf_pivot_count = pf_pivot_index.size();
  const HighsInt* pf_pivot_index = this->pf_pivot_index.data();
  const double* pf_pivot_value = this->pf_pivot_value.data();
  const HighsInt* pf_start = this->pf_start.data();
  const HighsInt* pf_index = this->pf_index.data();
  const double* pf_value = this->pf_value.data();

  // Alias to non constant
  HighsInt rhs_count = vector.count;
  HighsInt* rhs_index = vector.index.data();
  double* rhs_array = vector.array.data();

  // Backwardly
  for (HighsInt i = pf_pivot_count - 1; i >= 0; i--) {
    HighsInt pivotRow = pf_pivot_index[i];
    double pivot_multiplier = rhs_array[pivotRow];
    for (HighsInt k = pf_start[i]; k < pf_start[i + 1]; k++)
      pivot_multiplier -= pf_value[k] * rhs_array[pf_index[k]];
    pivot_multiplier /= pf_pivot_value[i];

    if (rhs_array[pivotRow] == 0) rhs_index[rhs_count++] = pivotRow;
    rhs_array[pivotRow] =
        (fabs(pivot_multiplier) < kHighsTiny) ? 1e-100 : pivot_multiplier;
  }

  // Save count
  vector.count = rhs_count;
}